

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::downsample(Mesh *this)

{
  Mesh *this_local;
  
  MeshResampler::downsample((MeshResampler *)&this->field_0x1e8,&this->mesh);
  Selection::clear(&((this->super_SceneObject).scene)->selected);
  Selection::clear(&((this->super_SceneObject).scene)->hovered);
  Selection::clear(&((this->super_SceneObject).scene)->elementTransform->target);
  return;
}

Assistant:

void Mesh::downsample() {
  resampler.downsample(mesh);
   scene->selected.clear();
   scene->hovered.clear();
   scene->elementTransform->target.clear();
}